

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_by_code.c
# Opt level: O0

int archive_read_support_filter_by_code(archive *a,int filter_code)

{
  int iVar1;
  int magic_test;
  int filter_code_local;
  archive *a_local;
  
  iVar1 = __archive_check_magic(a,0xdeb0c5,1,"archive_read_support_filter_by_code");
  if (iVar1 == -0x1e) {
    a_local._4_4_ = -0x1e;
  }
  else {
    switch(filter_code) {
    case 0:
      a_local._4_4_ = archive_read_support_filter_none(a);
      break;
    case 1:
      a_local._4_4_ = archive_read_support_filter_gzip(a);
      break;
    case 2:
      a_local._4_4_ = archive_read_support_filter_bzip2(a);
      break;
    case 3:
      a_local._4_4_ = archive_read_support_filter_compress(a);
      break;
    default:
      a_local._4_4_ = -0x1e;
      break;
    case 5:
      a_local._4_4_ = archive_read_support_filter_lzma(a);
      break;
    case 6:
      a_local._4_4_ = archive_read_support_filter_xz(a);
      break;
    case 7:
      a_local._4_4_ = archive_read_support_filter_uu(a);
      break;
    case 8:
      a_local._4_4_ = archive_read_support_filter_rpm(a);
      break;
    case 9:
      a_local._4_4_ = archive_read_support_filter_lzip(a);
      break;
    case 10:
      a_local._4_4_ = archive_read_support_filter_lrzip(a);
      break;
    case 0xb:
      a_local._4_4_ = archive_read_support_filter_lzop(a);
      break;
    case 0xc:
      a_local._4_4_ = archive_read_support_filter_grzip(a);
      break;
    case 0xd:
      a_local._4_4_ = archive_read_support_filter_lz4(a);
      break;
    case 0xe:
      a_local._4_4_ = archive_read_support_filter_zstd(a);
    }
  }
  return a_local._4_4_;
}

Assistant:

int
archive_read_support_filter_by_code(struct archive *a, int filter_code)
{
	archive_check_magic(a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_filter_by_code");

	switch (filter_code) {
	case ARCHIVE_FILTER_NONE:
		return archive_read_support_filter_none(a);
	case ARCHIVE_FILTER_GZIP:
		return archive_read_support_filter_gzip(a);
	case ARCHIVE_FILTER_BZIP2:
		return archive_read_support_filter_bzip2(a);
	case ARCHIVE_FILTER_COMPRESS:
		return archive_read_support_filter_compress(a);
	case ARCHIVE_FILTER_LZMA:
		return archive_read_support_filter_lzma(a);
	case ARCHIVE_FILTER_XZ:
		return archive_read_support_filter_xz(a);
	case ARCHIVE_FILTER_UU:
		return archive_read_support_filter_uu(a);
	case ARCHIVE_FILTER_RPM:
		return archive_read_support_filter_rpm(a);
	case ARCHIVE_FILTER_LZIP:
		return archive_read_support_filter_lzip(a);
	case ARCHIVE_FILTER_LRZIP:
		return archive_read_support_filter_lrzip(a);
	case ARCHIVE_FILTER_LZOP:
		return archive_read_support_filter_lzop(a);
	case ARCHIVE_FILTER_GRZIP:
		return archive_read_support_filter_grzip(a);
	case ARCHIVE_FILTER_LZ4:
		return archive_read_support_filter_lz4(a);
	case ARCHIVE_FILTER_ZSTD:
		return archive_read_support_filter_zstd(a);
	}
	return (ARCHIVE_FATAL);
}